

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

void extendFortressPiece(PieceEnv *env,Piece *p)

{
  int iVar1;
  int iVar2;
  uint offh;
  uint turn;
  uint corridor;
  
  switch(p->type) {
  case '\0':
  case '\x02':
    offh = 8;
    iVar1 = 3;
    extendFortress(env,p,8,3,0,0);
    extendFortress(env,p,8,3,-1,0);
    turn = 1;
    goto LAB_0010b7a3;
  case '\x01':
    offh = 1;
    iVar1 = 3;
    turn = 0;
    goto LAB_0010b7a3;
  case '\x03':
    offh = 2;
    extendFortress(env,p,2,0,0,0);
    extendFortress(env,p,2,0,-1,0);
    turn = 1;
    iVar1 = 0;
    goto LAB_0010b7a3;
  case '\x04':
    offh = 2;
    iVar1 = 6;
    turn = 1;
LAB_0010b7a3:
    corridor = 0;
    break;
  default:
    return;
  case '\x06':
    offh = 5;
    iVar1 = 3;
    corridor = 1;
    turn = 0;
    break;
  case '\a':
  case '\v':
    turn = 0;
    goto LAB_0010b7c1;
  case '\b':
    offh = 1;
    extendFortress(env,p,1,0,0,1);
    extendFortress(env,p,1,0,-1,1);
    iVar1 = 0;
    turn = offh;
    corridor = offh;
    break;
  case '\t':
    turn = 1;
    goto LAB_0010b7c1;
  case '\n':
    turn = 0xffffffff;
LAB_0010b7c1:
    offh = 1;
    iVar1 = 0;
    corridor = offh;
    break;
  case '\f':
    offh = 5;
    if (p->rot != '\0') {
      offh = (uint)(p->rot == '\x03') * 4 + 1;
    }
    iVar1 = nextInt(env->rng,8);
    extendFortress(env,p,offh,0,-1,(uint)(iVar1 != 0));
    iVar2 = nextInt(env->rng,8);
    iVar1 = 0;
    turn = 1;
    corridor = (uint)(iVar2 != 0);
    break;
  case '\r':
    offh = 5;
    extendFortress(env,p,5,3,0,1);
    iVar1 = 0xb;
    turn = 0;
    corridor = 1;
  }
  extendFortress(env,p,offh,iVar1,turn,corridor);
  return;
}

Assistant:

static
void extendFortressPiece(PieceEnv *env, Piece *p)
{
    if (p->type == BRIDGE_STRAIGHT) {
        extendFortress(env, p, 1, 3,  0, 0);
    } else if (p->type == BRIDGE_CROSSING || p->type == FORTRESS_START) {
        extendFortress(env, p, 8, 3,  0, 0);
        extendFortress(env, p, 8, 3, -1, 0);
        extendFortress(env, p, 8, 3,  1, 0);
    } else if (p->type == BRIDGE_FORTIFIED_CROSSING) {
        extendFortress(env, p, 2, 0,  0, 0);
        extendFortress(env, p, 2, 0, -1, 0);
        extendFortress(env, p, 2, 0,  1, 0);
    } else if (p->type == BRIDGE_STAIRS) {
        extendFortress(env, p, 2, 6,  1, 0);
    } else if (p->type == BRIDGE_CORRIDOR_ENTRANCE) {
        extendFortress(env, p, 5, 3,  0, 1);
    } else if (p->type == CORRIDOR_STRAIGHT) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_CROSSING) {
        extendFortress(env, p, 1, 0,  0, 1);
        extendFortress(env, p, 1, 0, -1, 1);
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_RIGHT) {
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_LEFT) {
        extendFortress(env, p, 1, 0, -1, 1);
    } else if (p->type == CORRIDOR_STAIRS) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_T_CROSSING) {
        int h = (p->rot == 0 || p->rot == 3) ? 5 : 1;
        extendFortress(env, p, h, 0, -1, nextInt(env->rng, 8) != 0);
        extendFortress(env, p, h, 0,  1, nextInt(env->rng, 8) != 0);
    } else if (p->type == CORRIDOR_NETHER_WART) {
        extendFortress(env, p, 5, 3,  0, 1);
        extendFortress(env, p, 5, 11, 0, 1);
    }
}